

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_DCT.cc
# Opt level: O0

void __thiscall Pl_DCT::compress(Pl_DCT *this,void *cinfo_p,Buffer *b)

{
  int iVar1;
  __array cinfo_00;
  uint uVar2;
  pointer outbuffer_00;
  Pipeline *pPVar3;
  pointer pMVar4;
  size_t sVar5;
  size_t sVar6;
  runtime_error *this_00;
  uchar *puVar7;
  unique_ptr<Pl_DCT::Members,_std::default_delete<Pl_DCT::Members>_> *this_01;
  uchar *buffer;
  JSAMPROW row_pointer [1];
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  size_t local_50;
  size_t expected_size;
  uint width;
  pointer local_38;
  uchar *outbuffer;
  __array outbuffer_ph;
  jpeg_compress_struct *cinfo;
  Buffer *b_local;
  void *cinfo_p_local;
  Pl_DCT *this_local;
  
  outbuffer_ph._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
  .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)cinfo_p;
  jpeg_CreateCompress(cinfo_p,0x50,0x248);
  std::make_unique<unsigned_char[]>((size_t)&outbuffer);
  outbuffer_00 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            &outbuffer);
  cinfo_00 = outbuffer_ph;
  local_38 = outbuffer_00;
  pPVar3 = Pipeline::next(&this->super_Pipeline);
  jpeg_pipeline_dest((j_compress_ptr)
                     cinfo_00._M_t.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,outbuffer_00,0x10000
                     ,pPVar3);
  this_01 = &this->m;
  pMVar4 = std::unique_ptr<Pl_DCT::Members,_std::default_delete<Pl_DCT::Members>_>::operator->
                     (this_01);
  *(JDIMENSION *)
   ((long)outbuffer_ph._M_t.
          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 0x30) = pMVar4->image_width;
  pMVar4 = std::unique_ptr<Pl_DCT::Members,_std::default_delete<Pl_DCT::Members>_>::operator->
                     (this_01);
  *(JDIMENSION *)
   ((long)outbuffer_ph._M_t.
          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 0x34) = pMVar4->image_height;
  pMVar4 = std::unique_ptr<Pl_DCT::Members,_std::default_delete<Pl_DCT::Members>_>::operator->
                     (this_01);
  *(int *)((long)outbuffer_ph._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 0x38) =
       pMVar4->components;
  pMVar4 = std::unique_ptr<Pl_DCT::Members,_std::default_delete<Pl_DCT::Members>_>::operator->
                     (this_01);
  *(J_COLOR_SPACE *)
   ((long)outbuffer_ph._M_t.
          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 0x3c) = pMVar4->color_space;
  jpeg_set_defaults(outbuffer_ph._M_t.
                    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
                    .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
  pMVar4 = std::unique_ptr<Pl_DCT::Members,_std::default_delete<Pl_DCT::Members>_>::operator->
                     (&this->m);
  if (pMVar4->config_callback != (CompressConfig *)0x0) {
    pMVar4 = std::unique_ptr<Pl_DCT::Members,_std::default_delete<Pl_DCT::Members>_>::operator->
                       (&this->m);
    (*pMVar4->config_callback->_vptr_CompressConfig[2])
              (pMVar4->config_callback,
               outbuffer_ph._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
  }
  jpeg_start_compress(outbuffer_ph._M_t.
                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,1);
  iVar1 = *(int *)((long)outbuffer_ph._M_t.
                         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                         .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 0x30);
  uVar2 = QIntC::to_uint<int>((int *)((long)outbuffer_ph._M_t.
                                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                            .super__Head_base<0UL,_unsigned_char_*,_false>.
                                            _M_head_impl + 0x38));
  expected_size._0_4_ = iVar1 * uVar2;
  sVar5 = QIntC::to_size<unsigned_int>
                    ((uint *)((long)outbuffer_ph._M_t.
                                    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                    .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                             0x34));
  sVar6 = QIntC::to_size<unsigned_int>
                    ((uint *)((long)outbuffer_ph._M_t.
                                    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                    .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                             0x30));
  local_50 = QIntC::to_size<int>((int *)((long)outbuffer_ph._M_t.
                                               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                               .super__Head_base<0UL,_unsigned_char_*,_false>.
                                               _M_head_impl + 0x38));
  local_50 = sVar5 * sVar6 * local_50;
  sVar5 = Buffer::getSize(b);
  if (sVar5 != local_50) {
    row_pointer[0]._7_1_ = 1;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    sVar5 = Buffer::getSize(b);
    std::__cxx11::to_string(&local_d0,sVar5);
    std::operator+(&local_b0,"Pl_DCT: image buffer size = ",&local_d0);
    std::operator+(&local_90,&local_b0,"; expected size = ");
    std::__cxx11::to_string(&local_f0,local_50);
    std::operator+(&local_70,&local_90,&local_f0);
    std::runtime_error::runtime_error(this_00,(string *)&local_70);
    row_pointer[0]._7_1_ = 0;
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar7 = Buffer::getBuffer(b);
  while (*(uint *)((long)outbuffer_ph._M_t.
                         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                         .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 0x154) <
         *(uint *)((long)outbuffer_ph._M_t.
                         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                         .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 0x34)) {
    buffer = puVar7 + (uint)(*(int *)((long)outbuffer_ph._M_t.
                                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                            .super__Head_base<0UL,_unsigned_char_*,_false>.
                                            _M_head_impl + 0x154) * (int)expected_size);
    jpeg_write_scanlines
              (outbuffer_ph._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,&buffer,1);
  }
  jpeg_finish_compress
            (outbuffer_ph._M_t.
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
  pPVar3 = Pipeline::next(&this->super_Pipeline);
  (*pPVar3->_vptr_Pipeline[3])();
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&outbuffer);
  return;
}

Assistant:

void
Pl_DCT::compress(void* cinfo_p, Buffer* b)
{
    auto* cinfo = reinterpret_cast<jpeg_compress_struct*>(cinfo_p);

#if ((defined(__GNUC__) && ((__GNUC__ * 100) + __GNUC_MINOR__) >= 406) || defined(__clang__))
# pragma GCC diagnostic push
# pragma GCC diagnostic ignored "-Wold-style-cast"
#endif
    jpeg_create_compress(cinfo);
#if ((defined(__GNUC__) && ((__GNUC__ * 100) + __GNUC_MINOR__) >= 406) || defined(__clang__))
# pragma GCC diagnostic pop
#endif
    static int const BUF_SIZE = 65536;
    auto outbuffer_ph = std::make_unique<unsigned char[]>(BUF_SIZE);
    unsigned char* outbuffer = outbuffer_ph.get();
    jpeg_pipeline_dest(cinfo, outbuffer, BUF_SIZE, next());

    cinfo->image_width = m->image_width;
    cinfo->image_height = m->image_height;
    cinfo->input_components = m->components;
    cinfo->in_color_space = m->color_space;
    jpeg_set_defaults(cinfo);
    if (m->config_callback) {
        m->config_callback->apply(cinfo);
    }

    jpeg_start_compress(cinfo, TRUE);

    unsigned int width = cinfo->image_width * QIntC::to_uint(cinfo->input_components);
    size_t expected_size = QIntC::to_size(cinfo->image_height) *
        QIntC::to_size(cinfo->image_width) * QIntC::to_size(cinfo->input_components);
    if (b->getSize() != expected_size) {
        throw std::runtime_error(
            "Pl_DCT: image buffer size = " + std::to_string(b->getSize()) +
            "; expected size = " + std::to_string(expected_size));
    }
    JSAMPROW row_pointer[1];
    unsigned char* buffer = b->getBuffer();
    while (cinfo->next_scanline < cinfo->image_height) {
        // We already verified that the buffer is big enough.
        row_pointer[0] = &buffer[cinfo->next_scanline * width];
        (void)jpeg_write_scanlines(cinfo, row_pointer, 1);
    }
    jpeg_finish_compress(cinfo);
    next()->finish();
}